

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O2

void __thiscall indigox::PeriodicTable::GeneratePeriodicTable(PeriodicTable *this)

{
  pointer pbVar1;
  Element *this_00;
  String *this_01;
  int iVar2;
  pointer __str;
  float chi;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  Element_p elem;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  String n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  String s;
  string local_d0;
  FileReader fr;
  String file;
  String path;
  string local_50;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (Options::DATA_DIRECTORY_abi_cxx11_._M_dataplus._M_p
      [Options::DATA_DIRECTORY_abi_cxx11_._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&Options::DATA_DIRECTORY_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)&path,(string *)&Options::DATA_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::string((string *)&file,(string *)&Options::PERIODIC_TABLE_FILE_abi_cxx11_);
  std::operator+(&n,&path,&file);
  utils::FileReader::FileReader(&fr,&n);
  std::__cxx11::string::~string((string *)&n);
  utils::FileReader::GetAllItems(&fr,&lines);
  std::__cxx11::string::string((string *)&n,"",(allocator *)&s);
  std::__cxx11::string::string((string *)&s,"",(allocator *)&local_110);
  pbVar1 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = 0;
  local_16c = 0.0;
  local_170 = 0.0;
  local_174 = 0.0;
  local_178 = 0.0;
  local_17c = 0;
  local_180 = 0;
  local_184 = 0;
  local_188 = 0;
  local_18c = 0;
  local_190 = 0;
  __str = lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__str == pbVar1) {
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)&n);
      std::__cxx11::string::~string((string *)&fr);
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&path);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      return;
    }
    switch(iVar2) {
    case 0:
      local_188 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
      break;
    case 1:
      utils::toUpperFirst(&local_110,__str);
      this_01 = &n;
      goto LAB_0010e9a9;
    case 2:
      utils::toUpperFirst(&local_110,__str);
      this_01 = &s;
LAB_0010e9a9:
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      break;
    case 3:
      local_16c = std::__cxx11::stof(__str,(size_t *)0x0);
      break;
    case 4:
      local_190 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
      break;
    case 5:
      local_18c = std::__cxx11::stoi(__str,(size_t *)0x0,10);
      break;
    case 6:
      local_184 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
      break;
    case 7:
      local_180 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
      break;
    case 8:
      local_17c = std::__cxx11::stoi(__str,(size_t *)0x0,10);
      break;
    case 9:
      local_170 = std::__cxx11::stof(__str,(size_t *)0x0);
      break;
    case 10:
      local_174 = std::__cxx11::stof(__str,(size_t *)0x0);
      break;
    case 0xb:
      local_178 = std::__cxx11::stof(__str,(size_t *)0x0);
      break;
    case 0xc:
      chi = std::__cxx11::stof(__str,(size_t *)0x0);
      this_00 = (Element *)operator_new(0x60);
      std::__cxx11::string::string((string *)&local_d0,(string *)&n);
      std::__cxx11::string::string((string *)&local_50,(string *)&s);
      Element::Element(this_00,(uint8_t)local_188,&local_d0,&local_50,local_16c,(uint8_t)local_190,
                       (uint8_t)local_18c,(uint8_t)local_184,(uint8_t)local_180,(uint8_t)local_17c,
                       local_170,local_174,local_178,chi);
      std::__shared_ptr<indigox::Element,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<indigox::Element,void>
                ((__shared_ptr<indigox::Element,(__gnu_cxx::_Lock_policy)2> *)&elem,this_00);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      local_110._M_dataplus._M_p._0_1_ =
           (elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Z_;
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>,std::_Select1st<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>>
      ::_M_emplace_unique<unsigned_char,std::shared_ptr<indigox::Element>&>
                ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>,std::_Select1st<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>>
                  *)this,(uchar *)&local_110,(shared_ptr<indigox::Element> *)&elem);
      std::__cxx11::string::string
                ((string *)&local_110,
                 (string *)
                 &(elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  symbol_);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
      ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
                  *)&this->name_to_,&local_110,&elem);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string
                ((string *)&local_110,
                 (string *)
                 elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
      ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
                  *)&this->name_to_,&local_110,&elem);
      std::__cxx11::string::~string((string *)&local_110);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      iVar2 = 0;
      goto LAB_0010ea07;
    }
    iVar2 = iVar2 + 1;
LAB_0010ea07:
    __str = __str + 1;
  } while( true );
}

Assistant:

void PeriodicTable::GeneratePeriodicTable() {
    /// @todo Check for duplicate elements and skip them.
    /// @todo Ensure all columns are populated.
    std::vector<String> lines;
    if (Options::DATA_DIRECTORY.back() != '/') {
      Options::DATA_DIRECTORY.append("/");
    }
    String path = Options::DATA_DIRECTORY;
    String file = Options::PERIODIC_TABLE_FILE;
    //if (path.back() != '/') path.append("/");
    utils::FileReader fr(path + file);
    fr.GetAllItems(lines);
    
    String n = "", s = "";
    uint8_t g = 0, p = 0, z = 0, v = 0, o = 0, h = 0;
    Float m = 0.0f, r = 0.0f, c = 0.0f, V = 0.0f, e = 0.0f;
    int count = 0;
    
    for (String& line : lines) {
      switch (count) {
        case 0: z = std::stoi(line); break;
        case 1: n = utils::toUpperFirst(&line); break;
        case 2: s = utils::toUpperFirst(&line); break;
        case 3: m = std::stof(line); break;
        case 4: g = std::stoi(line); break;
        case 5: p = std::stoi(line); break;
        case 6: v = std::stoi(line); break;
        case 7: o = std::stoi(line); break;
        case 8: h = std::stoi(line); break;
        case 9: r = std::stof(line); break;
        case 10: c = std::stof(line); break;
        case 11: V = std::stof(line); break;
        case 12: e = std::stof(line); break;
        default:
          break;
      }
      
      if (count == 12) {
        Element_p elem = Element_p(new Element(z, n, s, m, g, p, v, o, h, r, c,
                                               V, e));
        z_to_.emplace(elem->GetAtomicNumber(), elem);
        name_to_.emplace(elem->GetSymbol(), elem);
        name_to_.emplace(elem->GetName(), elem);
        count = 0;
      } else count++;
    }
  }